

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

LY_ERR lys_find_lypath_atoms(ly_path *path,ly_set **set)

{
  ulong local_60;
  ly_path_predicate *local_50;
  ulong uStack_38;
  LY_ERR ret__;
  uint64_t v;
  uint64_t u;
  LY_ERR ret;
  ly_set **set_local;
  ly_path *path_local;
  
  u._4_4_ = LY_SUCCESS;
  if (path == (ly_path *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","path",
           "lys_find_lypath_atoms");
    path_local._4_4_ = LY_EINVAL;
  }
  else if (set == (ly_set **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","set",
           "lys_find_lypath_atoms");
    path_local._4_4_ = LY_EINVAL;
  }
  else {
    path_local._4_4_ = ly_set_new(set);
    if (path_local._4_4_ == LY_SUCCESS) {
      v = 0;
      while( true ) {
        if (path == (ly_path *)0x0) {
          local_50 = (ly_path_predicate *)0x0;
        }
        else {
          local_50 = path[-1].predicates;
        }
        if ((local_50 <= v) ||
           (u._4_4_ = ly_set_add(*set,path[v].node,'\0',(uint32_t *)0x0), u._4_4_ != LY_SUCCESS))
        break;
        uStack_38 = 0;
        while( true ) {
          if (path[v].predicates == (ly_path_predicate *)0x0) {
            local_60 = 0;
          }
          else {
            local_60 = *(ulong *)((long)&path[v].predicates[-1].field_1 + 0x28);
          }
          if (local_60 <= uStack_38) break;
          if (((path[v].predicates[uStack_38].type == LY_PATH_PREDTYPE_LIST) ||
              (path[v].predicates[uStack_38].type == LY_PATH_PREDTYPE_LIST_VAR)) &&
             (u._4_4_ = ly_set_add(*set,path[v].predicates[uStack_38].field_1.field_1.key,'\0',
                                   (uint32_t *)0x0), u._4_4_ != LY_SUCCESS)) goto LAB_0018e3d6;
          uStack_38 = uStack_38 + 1;
        }
        v = v + 1;
      }
LAB_0018e3d6:
      if (u._4_4_ != LY_SUCCESS) {
        ly_set_free(*set,(_func_void_void_ptr *)0x0);
        *set = (ly_set *)0x0;
      }
      path_local._4_4_ = u._4_4_;
    }
  }
  return path_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_find_lypath_atoms(const struct ly_path *path, struct ly_set **set)
{
    LY_ERR ret = LY_SUCCESS;
    LY_ARRAY_COUNT_TYPE u, v;

    LY_CHECK_ARG_RET(NULL, path, set, LY_EINVAL);

    /* allocate return set */
    LY_CHECK_RET(ly_set_new(set));

    LY_ARRAY_FOR(path, u) {
        /* add nodes from the path */
        LY_CHECK_GOTO(ret = ly_set_add(*set, (void *)path[u].node, 0, NULL), cleanup);
        LY_ARRAY_FOR(path[u].predicates, v) {
            if ((path[u].predicates[v].type == LY_PATH_PREDTYPE_LIST) || (path[u].predicates[v].type == LY_PATH_PREDTYPE_LIST_VAR)) {
                /* add all the keys in a predicate */
                LY_CHECK_GOTO(ret = ly_set_add(*set, (void *)path[u].predicates[v].key, 0, NULL), cleanup);
            }
        }
    }

cleanup:
    if (ret) {
        ly_set_free(*set, NULL);
        *set = NULL;
    }
    return ret;
}